

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

uint64_t rapidjson::internal::BigInteger::MulAdd64
                   (uint64_t a,uint64_t b,uint64_t k,uint64_t *outHigh)

{
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (b & 0xffffffff) * (a & 0xffffffff);
  uVar5 = (b & 0xffffffff) * (a >> 0x20);
  lVar2 = (b >> 0x20) * (a >> 0x20);
  uVar4 = (a & 0xffffffff) * (b >> 0x20) + uVar5 + (uVar6 >> 0x20);
  lVar3 = lVar2 + 0x100000000;
  if (uVar5 <= uVar4) {
    lVar3 = lVar2;
  }
  uVar1 = (uVar6 & 0xffffffff) + k + (uVar4 << 0x20);
  *outHigh = (uVar4 >> 0x20) + lVar3 + (ulong)(uVar1 < k);
  return uVar1;
}

Assistant:

static uint64_t MulAdd64(uint64_t a, uint64_t b, uint64_t k, uint64_t* outHigh) {
#if defined(_MSC_VER) && defined(_M_AMD64)
        uint64_t low = _umul128(a, b, outHigh) + k;
        if (low < k)
            (*outHigh)++;
        return low;
#elif (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 6)) && defined(__x86_64__)
        __extension__ typedef unsigned __int128 uint128;
        uint128 p = static_cast<uint128>(a) * static_cast<uint128>(b);
        p += k;
        *outHigh = static_cast<uint64_t>(p >> 64);
        return static_cast<uint64_t>(p);
#else
        const uint64_t a0 = a & 0xFFFFFFFF, a1 = a >> 32, b0 = b & 0xFFFFFFFF, b1 = b >> 32;
        uint64_t x0 = a0 * b0, x1 = a0 * b1, x2 = a1 * b0, x3 = a1 * b1;
        x1 += (x0 >> 32); // can't give carry
        x1 += x2;
        if (x1 < x2)
            x3 += (static_cast<uint64_t>(1) << 32);
        uint64_t lo = (x1 << 32) + (x0 & 0xFFFFFFFF);
        uint64_t hi = x3 + (x1 >> 32);

        lo += k;
        if (lo < k)
            hi++;
        *outHigh = hi;
        return lo;
#endif
    }